

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_enc.h
# Opt level: O0

vec<4U,_float> * __thiscall
basisu::vec<4u,float>::set<3u,float>(vec<4U,_float> *this,vec<3U,_float> *other)

{
  uint uVar1;
  vec<4U,_float> *in_RSI;
  vec<4U,_float> *in_RDI;
  float fVar2;
  uint32_t m;
  uint32_t i;
  uint uVar3;
  
  if (in_RSI != in_RDI) {
    uVar1 = minimum<unsigned_int>(3,4);
    for (uVar3 = 0; uVar3 < uVar1; uVar3 = uVar3 + 1) {
      fVar2 = vec<3U,_float>::operator[]
                        ((vec<3U,_float> *)CONCAT44(uVar3,uVar1),(uint32_t)((ulong)in_RDI >> 0x20));
      in_RDI->m_v[uVar3] = fVar2;
    }
    for (; uVar3 < 4; uVar3 = uVar3 + 1) {
      in_RDI->m_v[uVar3] = 0.0;
    }
  }
  return in_RDI;
}

Assistant:

inline vec &set(const vec<OtherN, OtherT> &other)
		{
			uint32_t i;
			if ((const void *)(&other) == (const void *)(this))
				return *this;
			const uint32_t m = minimum(OtherN, N);
			for (i = 0; i < m; i++)
				m_v[i] = static_cast<T>(other[i]);
			for (; i < N; i++)
				m_v[i] = 0;
			return *this;
		}